

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# inja.hpp
# Opt level: O2

string * __thiscall
inja::Parser::load_file_abi_cxx11_(string *__return_storage_ptr__,Parser *this,string_view filename)

{
  undefined8 uVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> bStack_248;
  string_view filename_local;
  ifstream file;
  undefined8 auStack_130 [36];
  
  filename_local.size_ = filename.size_;
  filename_local.data_ = filename.data_;
  nonstd::sv_lite::basic_string_view::operator_cast_to_string
            (&bStack_248,(basic_string_view *)&filename_local);
  std::ifstream::ifstream(&file,(string *)&bStack_248,_S_in);
  std::__cxx11::string::~string((string *)&bStack_248);
  uVar1 = *(undefined8 *)((long)auStack_130 + *(long *)(_file + -0x18));
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  std::__cxx11::string::_M_construct<std::istreambuf_iterator<char,std::char_traits<char>>>
            ((string *)__return_storage_ptr__,uVar1,0xffffffffffffffff,0,0xffffffff);
  std::ifstream::~ifstream(&file);
  return __return_storage_ptr__;
}

Assistant:

std::string load_file(nonstd::string_view filename) {
		std::ifstream file(static_cast<std::string>(filename));
		std::string text((std::istreambuf_iterator<char>(file)), std::istreambuf_iterator<char>());
		return text;
	}